

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  uint uVar1;
  dasm_State *pdVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  uint *puVar10;
  uint *puVar11;
  byte *pbVar12;
  uint *puVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  ulong __n;
  uint *puVar17;
  byte bVar18;
  byte *pbVar19;
  uint *puVar20;
  byte *pbVar21;
  uint *__s;
  
  pdVar2 = ctx->D;
  iVar4 = pdVar2->maxsection;
  __s = (uint *)buffer;
  if (iVar4 < 1) {
LAB_00107775:
    return (uint)((uint *)((long)buffer + pdVar2->codesize) != __s) << 0x19;
  }
  lVar14 = 0;
LAB_00107284:
  puVar13 = (uint *)pdVar2->sections[lVar14].buf;
  puVar11 = (uint *)(pdVar2->sections[lVar14].rbuf + pdVar2->sections[lVar14].pos);
  if (puVar13 != puVar11) {
LAB_001072ad:
    puVar17 = (uint *)0x0;
    pbVar19 = pdVar2->actionlist + (int)*puVar13;
    puVar13 = puVar13 + 1;
switchD_001072fc_caseD_fd:
    pbVar12 = pbVar19;
    puVar10 = puVar17;
    bVar8 = *pbVar12;
    __n = 0;
    if ((byte)(bVar8 + 0x17) < 0x12) {
      __n = (ulong)*puVar13;
      puVar13 = puVar13 + 1;
    }
    uVar16 = (uint)__n;
    pbVar21 = pbVar12 + 1;
    if (bVar8 - 0xe9 < 0x17) goto code_r0x001072ef;
    goto LAB_001075ee;
  }
  goto LAB_00107761;
code_r0x001072ef:
  cVar15 = (char)__n;
  iVar4 = (int)__s;
  puVar17 = __s;
  pbVar19 = pbVar21;
  puVar20 = puVar13;
  switch((uint)bVar8) {
  case 0xe9:
    puVar17 = puVar10;
    if (puVar10 == (uint *)0x0) {
      puVar17 = __s;
    }
    puVar10 = (uint *)0x0;
    if ((*pbVar21 & 0xfe) == 0xee) {
      puVar10 = puVar17;
    }
    if (uVar16 == 0) {
      bVar8 = *(byte *)((long)puVar17 + -1);
      bVar18 = bVar8 & 7;
      if (bVar18 == 4) {
        bVar18 = (byte)*puVar17 & 7;
      }
      if (bVar18 != 5) {
        *(byte *)((long)puVar17 + -1) = bVar8 + 0x80;
        puVar17 = puVar10;
        goto switchD_001072fc_caseD_fd;
      }
    }
    else {
      if ((int)cVar15 != uVar16) break;
      bVar8 = *(byte *)((long)puVar17 + -1);
    }
    *(byte *)((long)puVar17 + -1) = bVar8 - 0x40;
    goto LAB_001076e6;
  default:
    goto LAB_001076e6;
  case 0xec:
    goto switchD_001072fc_caseD_ec;
  case 0xed:
    break;
  case 0xee:
    if ((int)cVar15 == uVar16) {
LAB_001075d1:
      if (puVar10 == (uint *)0x0) {
        puVar10 = __s;
      }
      *(byte *)((long)puVar10 + -2) = *(byte *)((long)puVar10 + -2) + 2;
      puVar10 = (uint *)0x0;
      goto LAB_001076e6;
    }
    puVar10 = (uint *)0x0;
    goto switchD_001072fc_caseD_ec;
  case 0xef:
    if ((int)cVar15 == uVar16) goto LAB_001075d1;
    puVar10 = (uint *)0x0;
    break;
  case 0xf0:
    bVar8 = pbVar12[1];
    pbVar19 = (byte *)((long)__s - (ulong)(bVar8 & 7));
    if (((__n & 8) == 0) || (0x9f < bVar8)) {
      if ((__n & 0x10) != 0) {
        if ((char)*pbVar19 < '\0') {
          *pbVar19 = 0xc5;
          pbVar19[1] = pbVar19[1] & 0x80 | pbVar19[2];
          pbVar19 = pbVar19 + 2;
        }
        if (pbVar19 + 1 < __s) {
          memmove(pbVar19,pbVar19 + 1,(size_t)(~(ulong)pbVar19 + (long)__s));
        }
        if (puVar10 != (uint *)0x0) {
          puVar10 = (uint *)((long)puVar10 + -1);
        }
        __s = (uint *)((long)__s + -1);
        __n = (ulong)(uVar16 & 7);
      }
      if (bVar8 < 0xc0) goto LAB_00107706;
      __n = (ulong)(uint)((int)__n << 4);
    }
    else {
      if ((char)*pbVar19 < '\0') {
        pbVar19[1] = pbVar19[1] ^ ' ' << (bVar8 >> 6);
      }
      else {
        *pbVar19 = *pbVar19 ^ '\x01' << (bVar8 >> 6);
      }
      __n = (ulong)(uVar16 & 7);
LAB_00107706:
      if (bVar8 < 0x40) {
        if (((int)__n == 4) && (bVar8 < 0x20)) {
          *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ 4;
          *(byte *)__s = 0x20;
          __s = (uint *)((long)__s + 1);
          __n = 4;
        }
      }
      else {
        __n = (ulong)(uint)((int)__n << 3);
      }
    }
    *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ (byte)__n;
    goto LAB_00107735;
  case 0xf1:
    puVar17 = puVar10;
    pbVar19 = pbVar12 + 2;
    if (uVar16 == 0) goto switchD_001072fc_caseD_fd;
    memset(__s,(uint)*pbVar21,__n);
    __s = (uint *)((long)__s + (ulong)(uVar16 - 1) + 1);
    goto LAB_00107735;
  case 0xf2:
  case 0xf9:
    goto switchD_001072fc_caseD_f2;
  case 0xf3:
    goto LAB_0010760e;
  case 0xf4:
    pbVar21 = pbVar12 + 2;
    if (-1 < (int)uVar16) goto LAB_00107471;
    puVar13 = puVar13 + 1;
    uVar16 = *(uint *)(pdVar2->globals + -uVar16);
LAB_0010760e:
    uVar16 = (uVar16 - iVar4) - 4;
    break;
  case 0xf5:
LAB_00107471:
    puVar20 = puVar13 + 1;
    piVar3 = pdVar2->sections[(int)uVar16 >> 0x18].rbuf;
    iVar9 = piVar3[(int)uVar16];
    if (iVar9 < 0) {
      uVar16 = piVar3[(long)(int)uVar16 + 1];
      puVar13 = puVar20;
      goto LAB_0010760e;
    }
    uVar1 = *puVar13;
    uVar16 = (uVar1 + ((int)buffer - iVar4) + iVar9) - 4;
    __n = (ulong)uVar16;
    puVar13 = puVar20;
    if (uVar1 != 0) {
      if (uVar1 == 4) {
        *(byte *)((long)__s + -2) = *(byte *)((long)__s + -1) - 0x10;
        __s = (uint *)((long)__s + -1);
      }
      else {
        *(byte *)((long)__s + -1) = 0xeb;
      }
LAB_001076e6:
      *(byte *)__s = (byte)__n;
      __s = (uint *)((long)__s + 1);
      puVar17 = puVar10;
      pbVar19 = pbVar21;
      puVar13 = puVar20;
      goto switchD_001072fc_caseD_fd;
    }
    break;
  case 0xf6:
    pbVar21 = pbVar12 + 2;
    if (-1 < (int)uVar16) goto LAB_001073bd;
    *(void **)__s = pdVar2->globals[-uVar16];
    __s = __s + 2;
    goto LAB_00107735;
  case 0xf7:
LAB_001073bd:
    piVar3 = pdVar2->sections[(int)uVar16 >> 0x18].rbuf;
    lVar6 = (long)piVar3[(int)uVar16];
    if (lVar6 < 0) {
      lVar6 = (long)piVar3[(long)(int)uVar16 + 1];
    }
    else {
      lVar6 = lVar6 + (long)buffer;
    }
    *(long *)__s = lVar6;
    __s = __s + 2;
    puVar17 = puVar10;
    pbVar19 = pbVar21;
    goto switchD_001072fc_caseD_fd;
  case 0xf8:
    puVar17 = puVar10;
    pbVar19 = pbVar12 + 2;
    if ((ulong)pbVar12[1] < 10) goto switchD_001072fc_caseD_fd;
    if (pbVar12[2] == 0xf2) {
      uVar16 = *puVar13;
    }
    pdVar2->globals[pbVar12[1]] = (void *)((long)(int)uVar16 + (long)buffer);
    goto LAB_00107735;
  case 0xfa:
    bVar8 = pbVar12[1];
    puVar17 = puVar10;
    pbVar19 = pbVar12 + 2;
    if ((iVar4 - (int)buffer & (uint)bVar8) == 0) goto switchD_001072fc_caseD_fd;
    pbVar19 = (byte *)((1 - (long)buffer) + (long)__s);
    do {
      *(byte *)__s = 0x90;
      __s = (uint *)((long)__s + 1);
      uVar16 = (uint)pbVar19;
      pbVar19 = pbVar19 + 1;
    } while ((uVar16 & bVar8) != 0);
LAB_00107735:
    puVar17 = puVar10;
    pbVar19 = pbVar12 + 2;
    goto switchD_001072fc_caseD_fd;
  case 0xfb:
    iVar9 = ctx->nreloc;
    if (199 < iVar9) {
      dasm_encode_cold_1();
    }
    bVar8 = *pbVar21;
    bVar18 = pbVar12[2];
    iVar5 = relocmap[bVar18];
    if (iVar5 < 0) {
      relocmap[bVar18] = ctx->nrelocsym;
      pcVar7 = sym_decorate((BuildCtx *)(ulong)ctx->mode,"",extnames[bVar18]);
      iVar9 = ctx->nrelocsym;
      ctx->relocsym[iVar9] = pcVar7;
      ctx->nrelocsym = iVar9 + 1;
      iVar9 = ctx->nreloc;
      iVar5 = relocmap[bVar18];
    }
    ctx->reloc[iVar9].ofs = iVar4 - *(int *)&ctx->code;
    ctx->reloc[iVar9].sym = iVar5;
    ctx->reloc[iVar9].type = (uint)bVar8;
    ctx->nreloc = iVar9 + 1;
    pbVar21 = pbVar12 + 3;
    uVar16 = 0;
    break;
  case 0xfc:
    bVar8 = pbVar12[1];
    pbVar21 = pbVar12 + 2;
LAB_001075ee:
    *(byte *)__s = bVar8;
    __s = (uint *)((long)__s + 1);
    goto switchD_001072fc_caseD_f2;
  case 0xfd:
    goto switchD_001072fc_caseD_fd;
  case 0xfe:
  case 0xff:
    goto switchD_001072fc_caseD_fe;
  }
  *__s = uVar16;
  __s = __s + 1;
switchD_001072fc_caseD_f2:
  puVar17 = puVar10;
  pbVar19 = pbVar21;
  goto switchD_001072fc_caseD_fd;
switchD_001072fc_caseD_fe:
  if (puVar13 == puVar11) goto code_r0x00107759;
  goto LAB_001072ad;
code_r0x00107759:
  iVar4 = pdVar2->maxsection;
LAB_00107761:
  lVar14 = lVar14 + 1;
  if (iVar4 <= lVar14) goto LAB_00107775;
  goto LAB_00107284;
switchD_001072fc_caseD_ec:
  *(short *)__s = (short)__n;
  __s = (uint *)((long)__s + 2);
  goto switchD_001072fc_caseD_f2;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n];
	  /* fallthrough */
	case DASM_REL_A: rel_a:
	  n -= (unsigned int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++;
	  if (n < 0) { dasma((ptrdiff_t)D->globals[-n]); break; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  dasma(*pb < 0 ? (ptrdiff_t)pb[1] : (*pb + (ptrdiff_t)base));
	  break;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}